

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall
tetgenmesh::formcavity
          (tetgenmesh *this,triface *searchtet,arraypool *missingshs,arraypool *crosstets,
          arraypool *topfaces,arraypool *botfaces,arraypool *toppoints,arraypool *botpoints)

{
  tetrahedron *pppdVar1;
  uint *puVar2;
  char *pcVar3;
  shellface *pppdVar4;
  arraypool *paVar5;
  tetrahedron P;
  int iVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  face *pfVar15;
  ulong *puVar16;
  long lVar17;
  tetrahedron ppdVar18;
  tetgenmesh *ptVar19;
  ulong uVar20;
  tetrahedron ppdVar21;
  arraypool *paVar22;
  long lVar23;
  tetrahedron *pppdVar24;
  tetrahedron *pppdVar25;
  bool bVar26;
  triface local_f0;
  ulong local_e0;
  triface *local_d8;
  int *local_d0;
  long *local_c8;
  arraypool *local_c0;
  arraypool *local_b8;
  triface *parytet;
  tetrahedron local_a8;
  ulong *local_a0;
  face *local_98;
  int types [2];
  triface local_78;
  int poss [4];
  triface *ptVar10;
  
  local_f0.tet = (tetrahedron *)0x0;
  local_f0.ver = 0;
  local_78.tet = (tetrahedron *)0x0;
  local_78.ver = 0;
  local_c0 = topfaces;
  local_b8 = missingshs;
  if (2 < this->b->verbose) {
    puts("      Form the cavity of a missing region.");
  }
  markedge(this,searchtet);
  arraypool::newindex(local_c0,&parytet);
  parytet->tet = searchtet->tet;
  parytet->ver = searchtet->ver;
  lVar17 = 0;
  local_e0 = 0;
  local_d8 = parytet;
  pfVar15 = (face *)0x0;
  do {
    paVar22 = local_c0;
    lVar7 = local_c0->objects;
    if ((lVar7 <= lVar17) || ((local_e0 & 1) != 0)) {
      for (lVar17 = 0; paVar5 = local_b8, lVar17 < lVar7; lVar17 = lVar17 + 1) {
        unmarkedge(this,(triface *)
                        (paVar22->toparray
                         [(uint)lVar17 >> ((byte)paVar22->log2objectsperblock & 0x1f)] +
                        (long)paVar22->objectbytes *
                        (long)(int)(paVar22->objectsperblockmark & (uint)lVar17)));
        lVar7 = paVar22->objects;
      }
      local_c0->objects = 0;
      if ((local_e0 & 1) == 0) {
        if (2 < this->b->verbose) {
          printf("      Formed cavity: %ld (%ld) cross tets (edges).\n",crosstets->objects,0);
        }
        for (lVar17 = 0; lVar17 < crosstets->objects; lVar17 = lVar17 + 1) {
          pcVar3 = crosstets->toparray
                   [(uint)lVar17 >> ((byte)crosstets->log2objectsperblock & 0x1f)];
          lVar13 = (long)crosstets->objectbytes *
                   (long)(int)(crosstets->objectsperblockmark & (uint)lVar17);
          uVar20 = *(ulong *)(*(long *)(pcVar3 + lVar13) +
                             (ulong)(eorgoppotbl[*(int *)(pcVar3 + lVar13 + 8)] & 3) * 8);
          local_f0.tet = (tetrahedron *)(uVar20 & 0xfffffffffffffff0);
          local_f0.ver = fsymtbl[eorgoppotbl[*(int *)(pcVar3 + lVar13 + 8)]][(uint)uVar20 & 0xf];
          lVar7 = (long)this->elemmarkerindex;
          if ((*(byte *)((long)local_f0.tet + lVar7 * 4) & 1) == 0) {
            arraypool::newindex(local_c0,&parytet);
            parytet->tet = local_f0.tet;
            parytet->ver = local_f0.ver;
            lVar7 = (long)this->elemmarkerindex;
          }
          uVar20 = *(ulong *)(*(long *)(pcVar3 + lVar13) +
                             (ulong)(edestoppotbl[*(int *)(pcVar3 + lVar13 + 8)] & 3) * 8);
          local_f0.tet = (tetrahedron *)(uVar20 & 0xfffffffffffffff0);
          local_f0.ver = fsymtbl[edestoppotbl[*(int *)(pcVar3 + lVar13 + 8)]][(uint)uVar20 & 0xf];
          if ((*(byte *)((long)local_f0.tet + lVar7 * 4) & 1) == 0) {
            arraypool::newindex(botfaces,&parytet);
            parytet->tet = local_f0.tet;
            parytet->ver = local_f0.ver;
          }
          lVar13 = (long)local_f0.ver;
          ppdVar21 = local_f0.tet[orgpivot[lVar13]];
          lVar7 = (long)this->pointmarkindex;
          uVar14 = *(uint *)((long)ppdVar21 + lVar7 * 4 + 4);
          ppdVar18 = (tetrahedron)this->dummypoint;
          if (ppdVar21 != ppdVar18 && (uVar14 & 1) == 0) {
            *(uint *)((long)ppdVar21 + lVar7 * 4 + 4) = uVar14 | 1;
            arraypool::newindex(botpoints,&local_c8);
            *local_c8 = (long)ppdVar21;
            arraypool::newindex(toppoints,&local_c8);
            *local_c8 = (long)ppdVar21;
            lVar13 = (long)local_f0.ver;
            lVar7 = (long)this->pointmarkindex;
            ppdVar18 = (tetrahedron)this->dummypoint;
          }
          ppdVar21 = local_f0.tet[destpivot[lVar13]];
          uVar14 = *(uint *)((long)ppdVar21 + lVar7 * 4 + 4);
          if (((uVar14 & 1) == 0) && (ppdVar21 != ppdVar18)) {
            *(uint *)((long)ppdVar21 + lVar7 * 4 + 4) = uVar14 | 1;
            arraypool::newindex(botpoints,&local_c8);
            *local_c8 = (long)ppdVar21;
            arraypool::newindex(toppoints,&local_c8);
            *local_c8 = (long)ppdVar21;
          }
        }
        lVar7 = 0;
        lVar17 = toppoints->objects;
        if (toppoints->objects < 1) {
          lVar17 = lVar7;
        }
        for (; lVar17 != lVar7; lVar7 = lVar7 + 1) {
          puVar2 = (uint *)(*(long *)(toppoints->toparray
                                      [(uint)lVar7 >> ((byte)toppoints->log2objectsperblock & 0x1f)]
                                     + (long)toppoints->objectbytes *
                                       (long)(int)(toppoints->objectsperblockmark & (uint)lVar7)) +
                            4 + (long)this->pointmarkindex * 4);
          *puVar2 = *puVar2 & 0xfffffffe;
        }
        lVar7 = 0;
        lVar17 = botpoints->objects;
        if (botpoints->objects < 1) {
          lVar17 = lVar7;
        }
        for (; bVar12 = (byte)local_e0, lVar17 != lVar7; lVar7 = lVar7 + 1) {
          puVar2 = (uint *)(*(long *)(botpoints->toparray
                                      [(uint)lVar7 >> ((byte)botpoints->log2objectsperblock & 0x1f)]
                                     + (long)botpoints->objectbytes *
                                       (long)(int)(botpoints->objectsperblockmark & (uint)lVar7)) +
                            4 + (long)this->pointmarkindex * 4);
          *puVar2 = *puVar2 & 0xfffffffe;
        }
        this->cavitycount = this->cavitycount + 1;
      }
      else {
        lVar7 = 0;
        lVar17 = crosstets->objects;
        if (crosstets->objects < 1) {
          lVar17 = lVar7;
        }
        for (; lVar17 != lVar7; lVar7 = lVar7 + 1) {
          puVar2 = (uint *)(*(long *)(crosstets->toparray
                                      [(uint)lVar7 >> ((byte)crosstets->log2objectsperblock & 0x1f)]
                                     + (long)crosstets->objectbytes *
                                       (long)(int)(crosstets->objectsperblockmark & (uint)lVar7)) +
                           (long)this->elemmarkerindex * 4);
          *puVar2 = *puVar2 & 0xfffffffe;
        }
        lVar7 = 0;
        lVar17 = botpoints->objects;
        if (botpoints->objects < 1) {
          lVar17 = lVar7;
        }
        for (; lVar17 != lVar7; lVar7 = lVar7 + 1) {
          puVar2 = (uint *)(*(long *)(botpoints->toparray
                                      [(uint)lVar7 >> ((byte)botpoints->log2objectsperblock & 0x1f)]
                                     + (long)botpoints->objectbytes *
                                       (long)(int)(botpoints->objectsperblockmark & (uint)lVar7)) +
                            4 + (long)this->pointmarkindex * 4);
          *puVar2 = *puVar2 & 0xfffffffe;
        }
        lVar7 = 0;
        lVar17 = toppoints->objects;
        if (toppoints->objects < 1) {
          lVar17 = lVar7;
        }
        for (; lVar17 != lVar7; lVar7 = lVar7 + 1) {
          puVar2 = (uint *)(*(long *)(toppoints->toparray
                                      [(uint)lVar7 >> ((byte)toppoints->log2objectsperblock & 0x1f)]
                                     + (long)toppoints->objectbytes *
                                       (long)(int)(toppoints->objectsperblockmark & (uint)lVar7)) +
                            4 + (long)this->pointmarkindex * 4);
          *puVar2 = *puVar2 & 0xfffffffe;
        }
        crosstets->objects = 0;
        botpoints->objects = 0;
        toppoints->objects = 0;
        uVar11 = randomnation(this,(int)local_b8->objects - 1);
        pcVar3 = paVar5->toparray[(int)(uint)uVar11 >> ((byte)paVar5->log2objectsperblock & 0x1f)];
        lVar17 = (long)paVar5->objectbytes * (long)(int)((uint)uVar11 & paVar5->objectsperblockmark)
        ;
        (this->recentsh).sh = *(shellface **)(pcVar3 + lVar17);
        (this->recentsh).shver = *(int *)(pcVar3 + lVar17 + 8);
        bVar12 = (byte)local_e0;
      }
      return (bool)(~bVar12 & 1);
    }
    local_d0 = (int *)local_c0->toparray
                      [(uint)lVar17 >> ((byte)local_c0->log2objectsperblock & 0x1f)];
    lVar23 = (long)local_c0->objectbytes * (long)(int)(local_c0->objectsperblockmark & (uint)lVar17)
    ;
    puVar16 = (ulong *)((long)local_d0 + lVar23);
    pppdVar24 = *(tetrahedron **)((long)local_d0 + lVar23);
    lVar13 = (long)*(int *)((long)local_d0 + lVar23 + 8);
    ppdVar21 = pppdVar24[orgpivot[lVar13]];
    lVar7 = (long)this->pointmarkindex;
    uVar14 = *(uint *)((long)ppdVar21 + lVar7 * 4 + 4);
    local_a0 = puVar16;
    local_98 = pfVar15;
    if ((uVar14 & 1) == 0) {
      *(uint *)((long)ppdVar21 + lVar7 * 4 + 4) = uVar14 | 1;
      local_a8 = ppdVar21;
      arraypool::newindex(botpoints,&local_c8);
      *local_c8 = (long)local_a8;
      pppdVar24 = (tetrahedron *)*puVar16;
      lVar13 = (long)(int)puVar16[1];
      lVar7 = (long)this->pointmarkindex;
    }
    ppdVar21 = pppdVar24[destpivot[lVar13]];
    uVar14 = *(uint *)((long)ppdVar21 + lVar7 * 4 + 4);
    if ((uVar14 & 1) == 0) {
      *(uint *)((long)ppdVar21 + lVar7 * 4 + 4) = uVar14 | 1;
      arraypool::newindex(toppoints,&local_c8);
      *local_c8 = (long)ppdVar21;
      pppdVar24 = (tetrahedron *)*local_a0;
    }
    piVar8 = (int *)((long)local_d0 + lVar23 + 8);
    puVar16 = local_a0;
    pppdVar25 = pppdVar24;
    local_d0 = piVar8;
    do {
      iVar6 = *piVar8;
      uVar14 = *(uint *)((long)pppdVar24 + (long)this->elemmarkerindex * 4);
      if ((uVar14 & 1) == 0) {
        *(uint *)((long)pppdVar24 + (long)this->elemmarkerindex * 4) = uVar14 | 1;
        arraypool::newindex(crosstets,&parytet);
        parytet->tet = pppdVar24;
        parytet->ver = iVar6;
        pppdVar25 = (tetrahedron *)*local_a0;
        puVar16 = local_a0;
      }
      pppdVar1 = pppdVar24 + facepivot1[iVar6];
      pppdVar24 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      piVar8 = facepivot2[iVar6] + ((uint)*pppdVar1 & 0xf);
      piVar9 = local_d0;
    } while (pppdVar25 != pppdVar24);
    do {
      local_d0 = (int *)(long)*piVar9;
      ppdVar21 = pppdVar25[apexpivot[(long)local_d0]];
      if ((ppdVar21 == (tetrahedron)this->dummypoint) ||
         (local_a8 = ppdVar21,
         (*(byte *)((long)ppdVar21 + (long)this->pointmarkindex * 4 + 4) & 2) != 0)) {
        uVar20 = local_e0 & 0xffffffff;
      }
      else {
        uVar14 = 0;
        bVar26 = true;
        while ((uVar14 < 2 && (bVar26))) {
          piVar8 = eprevtbl;
          if (uVar14 == 0) {
            piVar8 = enexttbl;
          }
          local_f0.ver = piVar8[(long)local_d0];
          local_f0.tet = pppdVar25;
          do {
            bVar26 = (*(uint *)((long)local_f0.tet + (long)this->elemmarkerindex * 4) &
                     0x40 << (*(byte *)(ver2edge + local_f0.ver) & 0x1f)) == 0;
            if (!bVar26) break;
            pppdVar24 = local_f0.tet + facepivot1[local_f0.ver];
            local_f0.tet = (tetrahedron *)((ulong)*pppdVar24 & 0xfffffffffffffff0);
            local_f0.ver = facepivot2[local_f0.ver][(uint)*pppdVar24 & 0xf];
          } while (pppdVar25 != local_f0.tet);
          uVar14 = uVar14 + 1;
        }
        if (bVar26) {
          ppdVar21 = pppdVar25[orgpivot[(long)local_d0]];
          ppdVar18 = pppdVar25[destpivot[(long)local_d0]];
          ptVar10 = local_d8;
          for (local_d8 = (triface *)0; P = local_a8, (long)local_d8 < local_b8->objects;
              local_d8 = (triface *)((long)local_d8 + 1)) {
            pcVar3 = local_b8->toparray
                     [(uint)local_d8 >> ((byte)local_b8->log2objectsperblock & 0x1f)];
            lVar13 = (long)local_b8->objectbytes *
                     (long)(int)(local_b8->objectsperblockmark & (uint)local_d8);
            local_98 = (face *)(pcVar3 + lVar13);
            lVar7 = *(long *)(pcVar3 + lVar13);
            iVar6 = *(int *)(pcVar3 + lVar13 + 8);
            ptVar19 = this;
            iVar6 = tri_edge_test(this,*(point *)(lVar7 + (long)sorgpivot[iVar6] * 8),
                                  *(point *)(lVar7 + (long)sdestpivot[iVar6] * 8),
                                  *(point *)(lVar7 + (long)sapexpivot[iVar6] * 8),(point)ppdVar18,
                                  (point)local_a8,(point)0x0,1,types,poss);
            ptVar10 = (triface *)CONCAT44(extraout_var,iVar6);
            uVar20 = CONCAT71((int7)((ulong)ptVar19 >> 8),1);
            uVar14 = (uint)(byte)local_e0;
            if (iVar6 != 0) {
              if (iVar6 == 2) {
                local_f0.ver = enexttbl[(long)local_d0];
                uVar14 = (uint)(byte)local_e0;
                if ((types[0] & 0xfffffffeU) != 8) {
                  uVar14 = 1;
                }
                uVar20 = (ulong)uVar14;
                ptVar10 = (triface *)0x2;
                local_f0.tet = pppdVar25;
              }
              goto LAB_00128722;
            }
            pppdVar4 = local_98->sh;
            iVar6 = local_98->shver;
            ptVar19 = this;
            iVar6 = tri_edge_test(this,(point)pppdVar4[sorgpivot[iVar6]],
                                  (point)pppdVar4[sdestpivot[iVar6]],
                                  (point)pppdVar4[sapexpivot[iVar6]],(point)P,(point)ppdVar21,
                                  (point)0x0,1,types,poss);
            ptVar10 = (triface *)CONCAT44(extraout_var_00,iVar6);
            if (iVar6 != 0) {
              if (iVar6 == 2) {
                local_f0.ver = eprevtbl[(long)local_d0];
                if ((types[0] & 0xfffffffeU) != 8) {
                  uVar14 = 1;
                }
                uVar20 = (ulong)uVar14;
                ptVar10 = (triface *)0x2;
                local_f0.tet = pppdVar25;
              }
              else {
                uVar20 = CONCAT71((int7)((ulong)ptVar19 >> 8),1);
              }
              goto LAB_00128722;
            }
            ptVar10 = (triface *)0x0;
          }
          uVar20 = local_e0 & 0xffffffff;
LAB_00128722:
          if (local_b8->objects <= (long)local_d8) {
            uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
            local_d8 = ptVar10;
            break;
          }
          local_d8 = ptVar10;
          if ((uVar20 & 1) != 0) break;
          local_a8 = (tetrahedron)CONCAT71(local_a8._1_7_,(char)uVar20);
          local_f0.ver = esymtbl[local_f0.ver];
          pppdVar24 = local_f0.tet;
          uVar14 = local_f0.ver;
          if ((local_f0.tet[8] != (tetrahedron)0x0) &&
             (local_f0.tet[8][ver2edge[local_f0.ver]] != (double *)0x0)) {
            pppdVar4 = local_98->sh;
            iVar6 = local_98->shver;
            report_selfint_face(this,(point)pppdVar4[sorgpivot[iVar6]],
                                (point)pppdVar4[sdestpivot[iVar6]],
                                (point)pppdVar4[sapexpivot[iVar6]],local_98,&local_f0,(int)ptVar10,
                                types,poss);
            pppdVar24 = local_f0.tet;
            uVar14 = local_f0.ver;
          }
          do {
            ppdVar21 = pppdVar24[9];
            if ((ppdVar21 != (tetrahedron)0x0) &&
               (local_78.tet = pppdVar24, local_78.ver = uVar14,
               ppdVar21[uVar14 & 3] != (double *)0x0)) goto LAB_00128841;
            local_78.tet = (tetrahedron *)((ulong)pppdVar24[uVar14 & 3] & 0xfffffffffffffff0);
            local_78.ver = fsymtbl[(int)uVar14][(uint)pppdVar24[uVar14 & 3] & 0xf];
            pppdVar24 = local_78.tet;
            uVar14 = local_78.ver;
          } while (local_f0.tet != local_78.tet);
          ppdVar21 = local_78.tet[9];
          if (ppdVar21 != (tetrahedron)0x0) {
LAB_00128841:
            if (ppdVar21[local_78.ver & 3] != (double *)0x0) {
              pppdVar4 = local_98->sh;
              iVar6 = local_98->shver;
              report_selfint_face(this,(point)pppdVar4[sorgpivot[iVar6]],
                                  (point)pppdVar4[sdestpivot[iVar6]],
                                  (point)pppdVar4[sapexpivot[iVar6]],local_98,&local_78,
                                  (int)local_d8,types,poss);
            }
          }
          puVar2 = (uint *)((long)local_f0.tet + (long)this->elemmarkerindex * 4);
          *puVar2 = *puVar2 | 0x40 << (*(byte *)(ver2edge + local_f0.ver) & 0x1f);
          paVar22 = local_c0;
          arraypool::newindex(local_c0,&parytet);
          parytet->tet = local_f0.tet;
          parytet->ver = local_f0.ver;
          uVar20 = CONCAT71((int7)((ulong)paVar22 >> 8),local_a8._0_1_);
          puVar16 = local_a0;
        }
        else {
          uVar20 = local_e0 & 0xffffffff;
          puVar16 = local_a0;
        }
      }
      pppdVar24 = pppdVar25 + facepivot1[(long)local_d0];
      pppdVar25 = (tetrahedron *)((ulong)*pppdVar24 & 0xfffffffffffffff0);
      local_e0 = uVar20 & 0xffffffff;
      piVar9 = facepivot2[(long)local_d0] + ((uint)*pppdVar24 & 0xf);
    } while ((tetrahedron *)*puVar16 != pppdVar25);
    lVar17 = lVar17 + 1;
    local_e0 = uVar20 & 0xffffffff;
    pfVar15 = local_98;
  } while( true );
}

Assistant:

bool tetgenmesh::formcavity(triface* searchtet, arraypool* missingshs,
                            arraypool* crosstets, arraypool* topfaces, 
                            arraypool* botfaces, arraypool* toppoints, 
                            arraypool* botpoints)
{
  arraypool *crossedges;
  triface spintet, neightet, chkface, *parytet;
  face *parysh = NULL;
  point pa, pd, pe, *parypt;
  bool testflag, invalidflag;
  int intflag, types[2], poss[4];
  int t1ver;
  int i, j, k;

  // Temporarily re-use 'topfaces' for all crossing edges.
  crossedges = topfaces;

  if (b->verbose > 2) {
    printf("      Form the cavity of a missing region.\n"); 
  }
  // Mark this edge to avoid testing it later.
  markedge(*searchtet);
  crossedges->newindex((void **) &parytet);
  *parytet = *searchtet;

  invalidflag = 0; 
  // Collect all crossing tets.  Each cross tet is saved in the standard
  //   form [d,e,#,#], where [d,e] is a crossing edge, d lies below R.
  //   NEITHER d NOR e is a vertex of R (!pmarktested). 
  for (i = 0; i < crossedges->objects && !invalidflag; i++) {
    // Get a crossing edge [d,e,#,#].
    searchtet = (triface *) fastlookup(crossedges, i);
    // Sort vertices into the bottom and top arrays.
    pd = org(*searchtet);
    if (!pinfected(pd)) {
      pinfect(pd);
      botpoints->newindex((void **) &parypt);
      *parypt = pd;
    }
    pe = dest(*searchtet);
    if (!pinfected(pe)) {
      pinfect(pe);
      toppoints->newindex((void **) &parypt);
      *parypt = pe;
    }

    // All tets sharing this edge are crossing tets.
    spintet = *searchtet;
    while (1) {
      if (!infected(spintet)) {
        infect(spintet);
        crosstets->newindex((void **) &parytet);
        *parytet = spintet;
      }
      // Go to the next crossing tet.
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    } // while (1)

    // Detect new crossing edges.
    spintet = *searchtet;
    while (1) {
      // spintet is [d,e,a,#], where d lies below R, and e lies above R. 
      pa = apex(spintet);
      if (pa != dummypoint) {
        if (!pmarktested(pa)) {
	      // There exists a crossing edge, either [e,a] or [a,d]. First check
          //   if the crossing edge has already be added, i.e.,to check if one
		  //   of the tetrahedron at this edge has been marked.
          testflag = true;
          for (j = 0; j < 2 && testflag; j++) {
            if (j == 0) {
              enext(spintet, neightet);
            } else {
              eprev(spintet, neightet);
            }
            while (1) {
              if (edgemarked(neightet)) {
                // This crossing edge has already been tested. Skip it.
                testflag = false;
                break;
              }
              fnextself(neightet);
              if (neightet.tet == spintet.tet) break;
            }
          } // j
          if (testflag) {
            // Test if [e,a] or [a,d] intersects R.
            // Do a brute-force search in the set of subfaces of R. Slow!
            //   Need to be improved!
            pd = org(spintet);
            pe = dest(spintet);
            for (k = 0; k < missingshs->objects; k++) {
              parysh = (face *) fastlookup(missingshs, k);
              intflag = tri_edge_test(sorg(*parysh), sdest(*parysh), 
                          sapex(*parysh), pe, pa, NULL, 1, types, poss);
              if (intflag > 0) {
                // Found intersection. 'a' lies below R.
				if (intflag == 2) {
                  enext(spintet, neightet);
				  if ((types[0] == (int) ACROSSFACE) || 
                      (types[0] == (int) ACROSSEDGE)) {
                    // Only this case is valid.
                  } else {
                    // A non-valid intersection. Maybe a PLC problem.
                    invalidflag = 1;
                  }
				} else {
				  // Coplanar intersection. Maybe a PLC problem.
				  invalidflag = 1;
				}
                break;
              }
              intflag = tri_edge_test(sorg(*parysh), sdest(*parysh), 
			              sapex(*parysh), pa, pd, NULL, 1, types, poss);
              if (intflag > 0) {
                // Found intersection. 'a' lies above R.
				if (intflag == 2) {
                  eprev(spintet, neightet);
				  if ((types[0] == (int) ACROSSFACE) || 
                      (types[0] == (int) ACROSSEDGE)) {
					// Only this case is valid.
                  } else {
				    // A non-valid intersection. Maybe a PLC problem.
                    invalidflag = 1;
                  }
				} else {
				  // Coplanar intersection. Maybe a PLC problem.
				  invalidflag = 1;
				}
                break;
              }
            } // k
            if (k < missingshs->objects) {
              // Found a pair of triangle - edge intersection.
              if (invalidflag) {
                break; // the while (1) loop
              }
              // Adjust the edge direction, so that its origin lies below R,
              //   and its destination lies above R.
              esymself(neightet);
              // This edge may be a segment.
              if (issubseg(neightet)) {
				report_selfint_face(sorg(*parysh), sdest(*parysh), 
                  sapex(*parysh),parysh,&neightet,intflag,types,poss);
              }
			  // Check if it is an edge of a subface.
			  chkface = neightet;
              while (1) {
                if (issubface(chkface)) break;
                fsymself(chkface);
                if (chkface.tet == neightet.tet) break;
              }
              if (issubface(chkface)) {
                // Two subfaces are intersecting.
                report_selfint_face(sorg(*parysh), sdest(*parysh), 
                  sapex(*parysh),parysh,&chkface,intflag,types,poss);
              }
			  
              // Mark this edge to avoid testing it again.
              markedge(neightet);
              crossedges->newindex((void **) &parytet);
              *parytet = neightet;            
            } else {
              // No intersection is found. It may be a PLC problem.
              invalidflag = 1;
              break; // the while (1) loop
            } // if (k == missingshs->objects)
          } // if (testflag)
	    } 
      } // if (pa != dummypoint)
      // Go to the next crossing tet.
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    } // while (1)
  } // i

  // Unmark all marked edges.
  for (i = 0; i < crossedges->objects; i++) {
    searchtet = (triface *) fastlookup(crossedges, i);
    unmarkedge(*searchtet);
  }
  crossedges->restart();


  if (invalidflag) {
    // Unmark all collected tets.
    for (i = 0; i < crosstets->objects; i++) {
      searchtet = (triface *) fastlookup(crosstets, i);
      uninfect(*searchtet);
    }
    // Unmark all collected vertices.
    for (i = 0; i < botpoints->objects; i++) {
      parypt = (point *) fastlookup(botpoints, i);
      puninfect(*parypt);
    }
    for (i = 0; i < toppoints->objects; i++) {
      parypt = (point *) fastlookup(toppoints, i);
      puninfect(*parypt);
    }
    crosstets->restart();
    botpoints->restart();
    toppoints->restart();

    // Randomly split an interior edge of R.
    i = randomnation(missingshs->objects - 1);
    recentsh = * (face *) fastlookup(missingshs, i);
    return false;
  }

  if (b->verbose > 2) {
    printf("      Formed cavity: %ld (%ld) cross tets (edges).\n", 
           crosstets->objects, crossedges->objects);
  }

  // Collect the top and bottom faces and the middle vertices. Since all top
  //   and bottom vertices have been infected. Uninfected vertices must be
  //   middle vertices (i.e., the vertices of R).
  // NOTE 1: Hull tets may be collected. Process them as a normal one.
  // NOTE 2: Some previously recovered subfaces may be completely inside the
  //   cavity. In such case, we remove these subfaces from the cavity and put
  //   them into 'subfacstack'. They will be recovered later.
  // NOTE 3: Some segments may be completely inside the cavity, e.g., they
  //   attached to a subface which is inside the cavity. Such segments are
  //   put in 'subsegstack'. They will be recovered later. 
  // NOTE4 : The interior subfaces and segments mentioned in NOTE 2 and 3
  //   are identified in the routine "carvecavity()". 

  for (i = 0; i < crosstets->objects; i++) {
    searchtet = (triface *) fastlookup(crosstets, i);
    // searchtet is [d,e,a,b].
    eorgoppo(*searchtet, spintet);
    fsym(spintet, neightet); // neightet is [a,b,e,#]
    if (!infected(neightet)) {
      // A top face.
      topfaces->newindex((void **) &parytet);
      *parytet = neightet;
    }
    edestoppo(*searchtet, spintet);
    fsym(spintet, neightet); // neightet is [b,a,d,#]
    if (!infected(neightet)) {
      // A bottom face.
      botfaces->newindex((void **) &parytet);
      *parytet = neightet;
    }
    // Add middle vertices if there are (skip dummypoint).
    pa = org(neightet);
    if (!pinfected(pa)) {
      if (pa != dummypoint) {
        pinfect(pa);
        botpoints->newindex((void **) &parypt);
        *parypt = pa;
        toppoints->newindex((void **) &parypt);
        *parypt = pa;
      }
    }
    pa = dest(neightet);
    if (!pinfected(pa)) {
      if (pa != dummypoint) {
        pinfect(pa);
        botpoints->newindex((void **) &parypt);
        *parypt = pa;
        toppoints->newindex((void **) &parypt);
        *parypt = pa;
      }
    }
  } // i

  // Uninfect all collected top, bottom, and middle vertices.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    puninfect(*parypt);
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    puninfect(*parypt);
  }
  cavitycount++;

  return true;
}